

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

bool __thiscall
MetaCommand::SetOptionRange
          (MetaCommand *this,string *optionName,string *name,string *rangeMin,string *rangeMax)

{
  bool bVar1;
  __type _Var2;
  reference pOVar3;
  reference pFVar4;
  string *in_RCX;
  __normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  iterator itField;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *fields;
  iterator it;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_ffffffffffffff78;
  __normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_50;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *local_48;
  Option *local_40;
  __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_38 [7];
  
  local_38[0]._M_current =
       (Option *)
       std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                 ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                  in_stack_ffffffffffffff78);
  do {
    local_40 = (Option *)
               std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                         ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                          in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_RSI,
                       (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_38);
    _Var2 = std::operator==(in_RDI,in_R8);
    if (_Var2) {
      pOVar3 = __gnu_cxx::
               __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
               ::operator*(local_38);
      local_48 = &pOVar3->fields;
      local_50._M_current =
           (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                              (in_stack_ffffffffffffff78);
      while( true ) {
        std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
                  (in_stack_ffffffffffffff78);
        bVar1 = __gnu_cxx::operator!=
                          (in_RSI,(__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                                   *)in_stack_ffffffffffffff78);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator*(&local_50);
        _Var2 = std::operator==(in_RDI,in_R8);
        if (_Var2) {
          pFVar4 = __gnu_cxx::
                   __normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                   ::operator*(&local_50);
          std::__cxx11::string::operator=((string *)&pFVar4->rangeMin,in_RCX);
          pFVar4 = __gnu_cxx::
                   __normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                   ::operator*(&local_50);
          std::__cxx11::string::operator=((string *)&pFVar4->rangeMax,(string *)in_R8);
          return true;
        }
        __gnu_cxx::
        __normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator++(&local_50);
      }
    }
    __gnu_cxx::
    __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator++(local_38);
  } while( true );
}

Assistant:

bool MetaCommand::SetOptionRange(METAIO_STL::string optionName,
                                 METAIO_STL::string name,
                                 METAIO_STL::string rangeMin,
                                 METAIO_STL::string rangeMax)
{
  auto it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      METAIO_STL::vector<Field> & fields = (*it).fields;
      auto itField = fields.begin();
      while(itField != fields.end())
        {
        if((*itField).name == name)
          {
          (*itField).rangeMin = rangeMin;
          (*itField).rangeMax = rangeMax;
          return true;
          }
        ++itField;
        }
      }
    ++it;
    }
  return false;
}